

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O1

bool __thiscall
DIS::ExplosionDescriptor::operator==(ExplosionDescriptor *this,ExplosionDescriptor *rhs)

{
  bool bVar1;
  
  bVar1 = EntityType::operator==(&this->_explodingObject,&rhs->_explodingObject);
  return ((bVar1 && this->_explosiveMaterial == rhs->_explosiveMaterial) &&
         this->_padding == rhs->_padding) && this->_explosiveForce == rhs->_explosiveForce;
}

Assistant:

bool ExplosionDescriptor::operator ==(const ExplosionDescriptor& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_explodingObject == rhs._explodingObject) ) ivarsEqual = false;
     if( ! (_explosiveMaterial == rhs._explosiveMaterial) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;
     if( ! (_explosiveForce == rhs._explosiveForce) ) ivarsEqual = false;

    return ivarsEqual;
 }